

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minmax_n_helpers.hpp
# Opt level: O2

void duckdb::MinMaxNOperation::
     Finalize<duckdb::ArgMinMaxNState<duckdb::MinMaxStringValue,duckdb::MinMaxStringValue,duckdb::LessThan>>
               (Vector *state_vector,AggregateInputData *param_2,Vector *result,idx_t count,
               idx_t offset)

{
  BinaryAggregateHeap<duckdb::string_t,_duckdb::string_t,_duckdb::LessThan> *this;
  ulong uVar1;
  Vector *vector;
  STORAGE_TYPE *pSVar2;
  idx_t iVar3;
  idx_t iVar4;
  idx_t i_1;
  ulong uVar5;
  long lVar6;
  long lVar7;
  HeapEntry<duckdb::string_t> *value;
  ulong uVar8;
  UnifiedVectorFormat state_format;
  long *local_78;
  long local_70;
  
  duckdb::UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)&local_78);
  duckdb::Vector::ToUnifiedFormat((ulong)state_vector,(UnifiedVectorFormat *)count);
  FlatVector::VerifyFlatVector(result);
  uVar1 = duckdb::ListVector::GetListSize(result);
  lVar6 = 0;
  for (iVar3 = 0; count != iVar3; iVar3 = iVar3 + 1) {
    iVar4 = iVar3;
    if (*local_78 != 0) {
      iVar4 = (idx_t)*(uint *)(*local_78 + iVar3 * 4);
    }
    lVar6 = lVar6 + *(long *)(*(long *)(local_70 + iVar4 * 8) + 0x10);
  }
  duckdb::ListVector::Reserve(result,lVar6 + uVar1);
  lVar6 = *(long *)(result + 0x20);
  vector = (Vector *)duckdb::ListVector::GetEntry(result);
  for (uVar5 = 0; uVar5 != count; uVar5 = uVar5 + 1) {
    uVar8 = uVar5;
    if (*local_78 != 0) {
      uVar8 = (ulong)*(uint *)(*local_78 + uVar5 * 4);
    }
    this = *(BinaryAggregateHeap<duckdb::string_t,_duckdb::string_t,_duckdb::LessThan> **)
            (local_70 + uVar8 * 8);
    if (((char)this[1].capacity == '\x01') && (iVar3 = this->size, iVar3 != 0)) {
      lVar7 = (uVar5 + offset) * 0x10;
      *(ulong *)(lVar6 + lVar7) = uVar1;
      *(idx_t *)(lVar6 + 8 + lVar7) = iVar3;
      pSVar2 = BinaryAggregateHeap<duckdb::string_t,_duckdb::string_t,_duckdb::LessThan>::
               SortAndGetHeap(this);
      value = &pSVar2->second;
      for (uVar8 = 0; iVar3 = uVar1 + uVar8, uVar8 < this->size; uVar8 = uVar8 + 1) {
        MinMaxStringValue::Assign(vector,iVar3,&value->value);
        value = value + 2;
      }
    }
    else {
      TemplatedValidityMask<unsigned_long>::SetInvalid
                ((TemplatedValidityMask<unsigned_long> *)(result + 0x28),uVar5 + offset);
      iVar3 = uVar1;
    }
    uVar1 = iVar3;
  }
  duckdb::ListVector::SetListSize(result,uVar1);
  duckdb::Vector::Verify((ulong)result);
  UnifiedVectorFormat::~UnifiedVectorFormat((UnifiedVectorFormat *)&local_78);
  return;
}

Assistant:

static void Finalize(Vector &state_vector, AggregateInputData &, Vector &result, idx_t count, idx_t offset) {

		UnifiedVectorFormat state_format;
		state_vector.ToUnifiedFormat(count, state_format);

		const auto states = UnifiedVectorFormat::GetData<STATE *>(state_format);
		auto &mask = FlatVector::Validity(result);

		const auto old_len = ListVector::GetListSize(result);

		// Count the number of new entries
		idx_t new_entries = 0;
		for (idx_t i = 0; i < count; i++) {
			const auto state_idx = state_format.sel->get_index(i);
			auto &state = *states[state_idx];
			new_entries += state.heap.Size();
		}

		// Resize the list vector to fit the new entries
		ListVector::Reserve(result, old_len + new_entries);

		const auto list_entries = FlatVector::GetData<list_entry_t>(result);
		auto &child_data = ListVector::GetEntry(result);

		idx_t current_offset = old_len;
		for (idx_t i = 0; i < count; i++) {
			const auto rid = i + offset;
			const auto state_idx = state_format.sel->get_index(i);
			auto &state = *states[state_idx];

			if (!state.is_initialized || state.heap.IsEmpty()) {
				mask.SetInvalid(rid);
				continue;
			}

			// Add the entries to the list vector
			auto &list_entry = list_entries[rid];
			list_entry.offset = current_offset;
			list_entry.length = state.heap.Size();

			// Turn the heap into a sorted list, invalidating the heap property
			auto heap = state.heap.SortAndGetHeap();

			for (idx_t slot = 0; slot < state.heap.Size(); slot++) {
				STATE::VAL_TYPE::Assign(child_data, current_offset++, state.heap.GetValue(heap[slot]));
			}
		}

		D_ASSERT(current_offset == old_len + new_entries);
		ListVector::SetListSize(result, current_offset);
		result.Verify(count);
	}